

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_FutureEdition_Test::
CommandLineInterfaceTest_Plugin_FutureEdition_Test
          (CommandLineInterfaceTest_Plugin_FutureEdition_Test *this)

{
  CommandLineInterfaceTest_Plugin_FutureEdition_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_Plugin_FutureEdition_Test_029fa740;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_FutureEdition) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("low_maximum");
  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "foo.proto: is a file using edition 2023, which isn't supported by code "
      "generator prefix-gen-plug.  Please ask the owner of this code generator "
      "to add support or switch back to a maximum of edition PROTO2.");
}